

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

void __thiscall
testing::internal::
scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
reset(scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p)

{
  string *this_00;
  bool bVar1;
  long in_RSI;
  long *in_RDI;
  
  if (in_RSI != *in_RDI) {
    bVar1 = IsTrue(true);
    if ((bVar1) && (this_00 = (string *)*in_RDI, this_00 != (string *)0x0)) {
      std::__cxx11::string::~string(this_00);
      operator_delete(this_00);
    }
    *in_RDI = in_RSI;
  }
  return;
}

Assistant:

void reset(T* p = nullptr) {
    if (p != ptr_) {
      if (IsTrue(sizeof(T) > 0)) {  // Makes sure T is a complete type.
        delete ptr_;
      }
      ptr_ = p;
    }
  }